

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_builder.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::SubjectBuilder::AddComponentAt
          (SubjectBuilder *this,int index,string *key,string *value)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->components_,
           (this->components_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + index,key);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->components_,
           (this->components_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + (long)index + 1,value);
  return;
}

Assistant:

void SubjectBuilder::AddComponentAt(int index, const std::string& key, const std::string& value)
{
    components_.insert(components_.begin() + index, key);
    components_.insert(components_.begin() + index + 1, value);
}